

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O1

void __thiscall
SolverAppTest_ParseOptionsBeforeReadingProblem_Test::
SolverAppTest_ParseOptionsBeforeReadingProblem_Test
          (SolverAppTest_ParseOptionsBeforeReadingProblem_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_SolverAppTest).super_Test._vptr_Test = (_func_int **)&PTR__SolverAppTest_00291c20;
  mp::SolverApp<TestSolver,_testing::StrictMock<MockNLReader<TestSolver>_>_>::SolverApp
            (&(this->super_SolverAppTest).app_);
  testing::StrictMock<MockOptionHandler>::StrictMock
            (&(this->super_SolverAppTest).handler_.super_StrictMock<MockOptionHandler>);
  (this->super_SolverAppTest).handler_.super_StrictMock<MockOptionHandler>._vptr_StrictMock =
       (_func_int **)&PTR__StrictMock_00291ea8;
  (this->super_SolverAppTest).output_handler_.super_OutputHandler.has_output = false;
  (this->super_SolverAppTest).output_handler_.super_OutputHandler.banner_size = 0;
  (this->super_SolverAppTest).output_handler_.super_OutputHandler._vptr_OutputHandler =
       (_func_int **)&PTR__OutputHandler_0028cf00;
  (this->super_SolverAppTest).output_handler_.output._M_dataplus._M_p =
       (pointer)&(this->super_SolverAppTest).output_handler_.output.field_2;
  (this->super_SolverAppTest).output_handler_.output._M_string_length = 0;
  (this->super_SolverAppTest).output_handler_.output.field_2._M_local_buf[0] = '\0';
  (this->super_SolverAppTest).super_Test._vptr_Test = (_func_int **)&PTR__SolverAppTest_0028a000;
  return;
}

Assistant:

TEST_F(SolverAppTest, ParseOptionsBeforeReadingProblem) {
  AddOption();
  testing::InSequence sequence;
  EXPECT_CALL(handler_, OnOption()).WillOnce(Return(true));
  EXPECT_CALL(app_.reader(), DoRead(_, _, _));
  EXPECT_EQ(0, app_.Run(Args("test", "-w", "testproblem")));
}